

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O0

vector<sfc::Tile,_std::allocator<sfc::Tile>_> * __thiscall
sfc::Tileset::remap_tiles_for_input
          (vector<sfc::Tile,_std::allocator<sfc::Tile>_> *__return_storage_ptr__,Tileset *this,
          vector<sfc::Tile,_std::allocator<sfc::Tile>_> *tiles,Mode mode)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference __x;
  runtime_error *this_00;
  uint uVar5;
  int iVar6;
  Tile local_c0;
  uint local_58;
  uint local_54;
  uint xo;
  uint yo;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> metatile;
  uint i;
  uint cells_per_tile_v;
  uint cells_per_tile_h;
  Mode mode_local;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> *tiles_local;
  Tileset *this_local;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> *tv;
  
  std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::vector(__return_storage_ptr__);
  if (((mode != snes) || ((this->_tile_width != 0x10 && (this->_tile_height != 0x10)))) &&
     (((mode != gb && (mode != gbc)) || (this->_tile_height != 0x10)))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"programmer error (remap_tiles_for_input invoked erroneously invoked)");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = this->_tile_width >> 3;
  uVar1 = this->_tile_height >> 3;
  for (metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar3 = (ulong)metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar4 = std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::size(&this->_tiles), uVar3 < sVar4
      ; metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::vector
              ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)&xo);
    for (local_54 = 0; local_54 < uVar1; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < uVar5; local_58 = local_58 + 1) {
        iVar6 = 1;
        if (mode == snes) {
          iVar6 = 0x10;
        }
        uVar2 = metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ + local_54 * iVar6 + local_58;
        sVar4 = std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::size(tiles);
        if (uVar2 < sVar4) {
          iVar6 = 1;
          if (mode == snes) {
            iVar6 = 0x10;
          }
          __x = std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::operator[]
                          (tiles,(ulong)(metatile.
                                         super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                         local_54 * iVar6 + local_58));
          std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::push_back
                    ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)&xo,__x);
        }
      }
    }
    sVar4 = std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::size
                      ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)&xo);
    if (sVar4 == uVar5 * uVar1) {
      Tile::Tile(&local_c0,(vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)&xo,
                 (bool)(this->_no_flip & 1),this->_tile_width,this->_tile_height);
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::push_back
                (__return_storage_ptr__,&local_c0);
      Tile::~Tile(&local_c0);
    }
    std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector
              ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)&xo);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tile> Tileset::remap_tiles_for_input(const std::vector<Tile>& tiles, Mode mode) const {
  std::vector<Tile> tv;

  if ((mode == Mode::snes && (_tile_width == 16 || _tile_height == 16))
      || ( (mode == Mode::gb || mode == Mode::gbc) && _tile_height == 16)) {
    const unsigned cells_per_tile_h = _tile_width / 8;
    const unsigned cells_per_tile_v = _tile_height / 8;

    for (unsigned i = 0; i < _tiles.size(); ++i) {
      std::vector<Tile> metatile;
      for (unsigned yo = 0; yo < cells_per_tile_v; ++yo) {
        for (unsigned xo = 0; xo < cells_per_tile_h; ++xo) {
          if ((i + (yo * (mode == Mode::snes ? 16:1)) + xo) < tiles.size())
            metatile.push_back(tiles[i + (yo * (mode == Mode::snes ? 16:1)) + xo]);
        }
      }
      if (metatile.size() == cells_per_tile_h * cells_per_tile_v)
        tv.push_back(Tile(metatile, _no_flip, _tile_width, _tile_height));
    }

  } else {
    throw std::runtime_error("programmer error (remap_tiles_for_input invoked erroneously invoked)");
  }

  return tv;
}